

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutionReport.h
# Opt level: O3

void __thiscall
FIX40::ExecutionReport::ExecutionReport
          (ExecutionReport *this,OrderID *aOrderID,ExecID *aExecID,ExecTransType *aExecTransType,
          OrdStatus *aOrdStatus,Symbol *aSymbol,Side *aSide,OrderQty *aOrderQty,
          LastShares *aLastShares,LastPx *aLastPx,CumQty *aCumQty,AvgPx *aAvgPx)

{
  FieldBase local_88;
  
  MsgType();
  FIX40::Message::Message(&this->super_Message,(MsgType *)&local_88);
  FIX::FieldBase::~FieldBase(&local_88);
  *(undefined ***)&this->super_Message = &PTR__Message_0032b010;
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aOrderID,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aExecID,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aExecTransType,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aOrdStatus,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aSymbol,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aSide,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aOrderQty,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aLastShares,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aLastPx,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aCumQty,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aAvgPx,true);
  return;
}

Assistant:

ExecutionReport(
      const FIX::OrderID& aOrderID,
      const FIX::ExecID& aExecID,
      const FIX::ExecTransType& aExecTransType,
      const FIX::OrdStatus& aOrdStatus,
      const FIX::Symbol& aSymbol,
      const FIX::Side& aSide,
      const FIX::OrderQty& aOrderQty,
      const FIX::LastShares& aLastShares,
      const FIX::LastPx& aLastPx,
      const FIX::CumQty& aCumQty,
      const FIX::AvgPx& aAvgPx )
    : Message(MsgType())
    {
      set(aOrderID);
      set(aExecID);
      set(aExecTransType);
      set(aOrdStatus);
      set(aSymbol);
      set(aSide);
      set(aOrderQty);
      set(aLastShares);
      set(aLastPx);
      set(aCumQty);
      set(aAvgPx);
    }